

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O2

wasm_u16_t setup_params(wasmbox_mutable_function_t *func,wasmbox_type_t *type)

{
  wasm_u16_t wVar1;
  wasm_u16_t wVar2;
  wasm_s16_t wVar3;
  int i;
  uint uVar4;
  
  wVar1 = func->stack_top;
  wVar2 = type->return_size;
  for (uVar4 = 0; uVar4 < type->argument_size; uVar4 = uVar4 + 1) {
    wVar3 = wasmbox_function_pop_stack(func);
    wasmbox_code_add_move(func,(int)wVar3,(ushort)(wVar2 + wVar1 + 2) + uVar4);
  }
  return wVar1;
}

Assistant:

static wasm_u16_t setup_params(wasmbox_mutable_function_t *func,
                               wasmbox_type_t *type) {
  wasm_u16_t stack_top = func->stack_top;
  wasm_u16_t argument_to =
      stack_top + type->return_size + WASMBOX_FUNCTION_CALL_OFFSET;
  for (int i = 0; i < type->argument_size; ++i) {
    wasmbox_code_add_move(func, wasmbox_function_pop_stack(func),
                          argument_to + i);
  }
  return stack_top;
}